

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_stl_sorting(void)

{
  double dVar1;
  double dVar2;
  int iVar3;
  time_t tVar4;
  ostream *poVar5;
  int iVar6;
  iterator it;
  smoothsort_ptr<double> *psVar7;
  bool bVar8;
  sorted_ptr_arr<double> sorted_data;
  vector<double,_std::allocator<double>_> to_sort;
  
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  to_sort.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  to_sort.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  to_sort.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(&to_sort,10);
  iVar6 = 10;
  while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
    iVar3 = rand();
    sorted_data.ptr_arr =
         (smoothsort_ptr<double> *)(double)(int)(((double)iVar3 * 100.0) / 2147483647.0);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&to_sort,(double *)&sorted_data);
  }
  sorted_ptr_arr<double>::sorted_ptr_arr<std::vector<double,std::allocator<double>>>
            (&sorted_data,&to_sort);
  dVar1 = *(sorted_data.ptr_arr)->element;
  bVar8 = false;
  for (psVar7 = sorted_data.ptr_arr; psVar7 != sorted_data.ptr_arr + sorted_data.N;
      psVar7 = psVar7 + 1) {
    dVar2 = *psVar7->element;
    poVar5 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar5,"\t");
    bVar8 = (bool)(bVar8 | dVar2 < (double)(int)dVar1);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  if (bVar8) {
    poVar5 = std::operator<<((ostream *)&std::cout,"# NOT SORTED");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  sorted_ptr_arr<double>::~sorted_ptr_arr(&sorted_data);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&to_sort.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void test_stl_sorting() {
	srand(time(NULL));
	std::vector<double> to_sort;
	to_sort.reserve(10);
	for(unsigned int i=0; i<10; i++) {
		to_sort.push_back((int)(100*(double)rand()/(double)RAND_MAX));
	}
	
	sorted_ptr_arr<double> sorted_data(to_sort);
	int last = sorted_data[0];
	bool not_sorted = false;
	for(sorted_ptr_arr<double>::iterator it=sorted_data.begin(); it != sorted_data.end(); ++it) {
		if(last > *it) { not_sorted = true; }
		std::cout << *it << "\t";
	}
	std::cout << std::endl;
	if(not_sorted) { std::cout << "# NOT SORTED" << std::endl; }
}